

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<int_(int,_int,_int,_int)>::Invoke
          (FunctionMocker<int_(int,_int,_int,_int)> *this,int args,int args_1,int args_2,int args_3)

{
  Result RVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<int> *pAVar2;
  ArgumentTuple tuple;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_18 = args_3;
  local_14 = args_2;
  local_10 = args_1;
  local_c = args;
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&local_18)
  ;
  pAVar2 = DownCast_<testing::internal::ActionResultHolder<int>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  RVar1 = (pAVar2->result_).value_;
  (*(pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar2);
  return RVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }